

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QRegularExpressionMatch __thiscall
QRegularExpressionMatchIterator::next(QRegularExpressionMatchIterator *this)

{
  QRegularExpressionMatchPrivate *pQVar1;
  QRegularExpressionMatchIteratorPrivate *pQVar2;
  QRegularExpressionMatch *__old_val;
  QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> *in_RSI;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> local_28;
  QRegularExpression local_20;
  
  local_20.d.d.ptr =
       (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
       ((totally_ordered_wrapper<QRegularExpressionPrivate_*> *)(in_FS_OFFSET + 0x28))->ptr;
  pQVar1 = (((in_RSI->d).ptr)->next).d.d.ptr;
  if ((pQVar1->isValid == true) &&
     ((pQVar1->hasMatch != false || (pQVar1->hasPartialMatch != false)))) {
    QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>::detach(in_RSI);
    pQVar2 = (in_RSI->d).ptr;
    QRegularExpressionMatchPrivate::nextMatch
              ((QRegularExpressionMatchPrivate *)&stack0xffffffffffffffd8);
    (this->d).d.ptr = (QRegularExpressionMatchIteratorPrivate *)(pQVar2->next).d.d.ptr;
    (pQVar2->next).d.d.ptr = (QRegularExpressionMatchPrivate *)local_28.d.ptr;
    local_28.d.ptr =
         (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)
         (QRegularExpressionMatchPrivate *)0x0;
    QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>::~QExplicitlySharedDataPointer
              (&stack0xffffffffffffffd8);
  }
  else {
    (this->d).d.ptr = (QRegularExpressionMatchIteratorPrivate *)pQVar1;
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  if ((QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
      ((totally_ordered_wrapper<QRegularExpressionPrivate_*> *)(in_FS_OFFSET + 0x28))->ptr ==
      local_20.d.d.ptr) {
    return (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatch QRegularExpressionMatchIterator::next()
{
    if (!hasNext()) {
        qWarning("QRegularExpressionMatchIterator::next() called on an iterator already at end");
        return d.constData()->next;
    }

    d.detach();
    return std::exchange(d->next, d->next.d.constData()->nextMatch());
}